

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode set_login(connectdata *conn,char *user,char *passwd,char *options)

{
  char *pcVar1;
  CURLcode local_2c;
  CURLcode result;
  char *options_local;
  char *passwd_local;
  char *user_local;
  connectdata *conn_local;
  
  local_2c = CURLE_OK;
  if (((conn->handler->flags & 0x20) == 0) || (((conn->bits).user_passwd & 1U) != 0)) {
    pcVar1 = (*Curl_cstrdup)(user);
    conn->user = pcVar1;
    if (conn->user == (char *)0x0) {
      conn->passwd = (char *)0x0;
    }
    else {
      pcVar1 = (*Curl_cstrdup)(passwd);
      conn->passwd = pcVar1;
    }
  }
  else {
    pcVar1 = (*Curl_cstrdup)("anonymous");
    conn->user = pcVar1;
    if (conn->user == (char *)0x0) {
      conn->passwd = (char *)0x0;
    }
    else {
      pcVar1 = (*Curl_cstrdup)("ftp@example.com");
      conn->passwd = pcVar1;
    }
  }
  if ((conn->user == (char *)0x0) || (conn->passwd == (char *)0x0)) {
    local_2c = CURLE_OUT_OF_MEMORY;
  }
  if ((local_2c == CURLE_OK) && (*options != '\0')) {
    pcVar1 = (*Curl_cstrdup)(options);
    conn->options = pcVar1;
    if (conn->options == (char *)0x0) {
      local_2c = CURLE_OUT_OF_MEMORY;
    }
  }
  return local_2c;
}

Assistant:

static CURLcode set_login(struct connectdata *conn,
                          const char *user, const char *passwd,
                          const char *options)
{
  CURLcode result = CURLE_OK;

  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) && !conn->bits.user_passwd) {
    /* Store the default user */
    conn->user = strdup(CURL_DEFAULT_USER);

    /* Store the default password */
    if(conn->user)
      conn->passwd = strdup(CURL_DEFAULT_PASSWORD);
    else
      conn->passwd = NULL;

    /* This is the default password, so DON'T set conn->bits.user_passwd */
  }
  else {
    /* Store the user, zero-length if not set */
    conn->user = strdup(user);

    /* Store the password (only if user is present), zero-length if not set */
    if(conn->user)
      conn->passwd = strdup(passwd);
    else
      conn->passwd = NULL;
  }

  if(!conn->user || !conn->passwd)
    result = CURLE_OUT_OF_MEMORY;

  /* Store the options, null if not set */
  if(!result && options[0]) {
    conn->options = strdup(options);

    if(!conn->options)
      result = CURLE_OUT_OF_MEMORY;
  }

  return result;
}